

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doShowAttachment(QPDFJob *this,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *name;
  bool bVar1;
  runtime_error *this_00;
  element_type *peVar2;
  element_type *key;
  element_type *peVar3;
  element_type *p;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  QPDFObjectHandle efs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  shared_ptr<QPDFFileSpecObjectHelper> fs;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  name = &fs.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)name,pdf);
  std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
            );
  QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
            ((QPDFEmbeddedFileDocumentHelper *)local_48,(string *)name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (!bVar1) {
    efs.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68,"attachment ",&peVar2->attachment_to_show);
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68," not found");
    std::runtime_error::runtime_error(this_00,(string *)&local_78);
    efs.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  key = std::__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"",&local_d1);
  QPDFFileSpecObjectHelper::getEmbeddedFileStream
            ((QPDFFileSpecObjectHelper *)local_b0,(string *)key);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  QPDFLogger::saveToStandardOutput(peVar3,true);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  QPDFLogger::getSave((QPDFLogger *)&local_e8,SUB81(peVar3,0));
  p = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get(&local_e8);
  QPDFObjectHandle::pipeStreamData((QPDFObjectHandle *)local_b0,p,0,qpdf_dl_all,false,false);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_e8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b0);
  std::shared_ptr<QPDFFileSpecObjectHelper>::~shared_ptr
            ((shared_ptr<QPDFFileSpecObjectHelper> *)local_48);
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)
             &fs.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFJob::doShowAttachment(QPDF& pdf)
{
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    auto fs = efdh.getEmbeddedFile(m->attachment_to_show);
    if (!fs) {
        throw std::runtime_error("attachment " + m->attachment_to_show + " not found");
    }
    auto efs = fs->getEmbeddedFileStream();
    // saveToStandardOutput has already been called, but it's harmless to call it again, so do as
    // defensive coding.
    m->log->saveToStandardOutput(true);
    efs.pipeStreamData(m->log->getSave().get(), 0, qpdf_dl_all);
}